

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O0

void verona::merge(Bounds *lhs,Bounds *rhs)

{
  iterator iVar1;
  bool bVar2;
  reference __in;
  type *__x;
  mapped_type *this;
  pointer ppVar3;
  pointer ppVar4;
  iterator __first;
  iterator __last;
  __normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
  local_90;
  const_iterator local_88;
  shared_ptr<verona::BtypeDef> *local_80;
  shared_ptr<verona::BtypeDef> *local_78;
  __normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
  local_70;
  __normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
  local_68;
  const_iterator local_60;
  _Self local_58;
  _Self local_50;
  iterator it;
  type *v;
  type *k;
  _Self local_30;
  iterator __end1;
  iterator __begin1;
  Bounds *__range1;
  Bounds *rhs_local;
  Bounds *lhs_local;
  
  __end1 = std::
           map<trieste::Location,_verona::Bound,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
           ::begin(rhs);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<trieste::Location,_verona::Bound,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
       ::end(rhs);
  while( true ) {
    bVar2 = std::operator==(&__end1,&local_30);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __in = std::_Rb_tree_iterator<std::pair<const_trieste::Location,_verona::Bound>_>::operator*
                     (&__end1);
    __x = ::std::get<0ul,trieste::Location_const,verona::Bound>(__in);
    it._M_node = (_Base_ptr)::std::get<1ul,trieste::Location_const,verona::Bound>(__in);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<trieste::Location,_verona::Bound,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
         ::find(lhs,__x);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<trieste::Location,_verona::Bound,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
         ::end(lhs);
    bVar2 = std::operator==(&local_50,&local_58);
    iVar1 = it;
    if (bVar2) {
      this = std::
             map<trieste::Location,_verona::Bound,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
             ::operator[](lhs,__x);
      Bound::operator=(this,(Bound *)iVar1._M_node);
    }
    else {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_trieste::Location,_verona::Bound>_>::
               operator->(&local_50);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_trieste::Location,_verona::Bound>_>::
               operator->(&local_50);
      local_68._M_current =
           (shared_ptr<verona::BtypeDef> *)
           std::
           vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
           ::end(&(ppVar4->second).lower);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<verona::BtypeDef>const*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>
      ::__normal_iterator<std::shared_ptr<verona::BtypeDef>*>
                ((__normal_iterator<std::shared_ptr<verona::BtypeDef>const*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>
                  *)&local_60,&local_68);
      local_70._M_current =
           (shared_ptr<verona::BtypeDef> *)
           std::
           vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
           ::begin((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
                    *)it._M_node);
      local_78 = (shared_ptr<verona::BtypeDef> *)
                 std::
                 vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
                 ::end((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
                        *)it._M_node);
      local_80 = (shared_ptr<verona::BtypeDef> *)
                 ::std::
                 vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
                 ::
                 insert<__gnu_cxx::__normal_iterator<std::shared_ptr<verona::BtypeDef>*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>,void>
                           ((vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
                             *)&ppVar3->second,local_60,local_70,
                            (__normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
                             )local_78);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_trieste::Location,_verona::Bound>_>::
               operator->(&local_50);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_trieste::Location,_verona::Bound>_>::
               operator->(&local_50);
      local_90._M_current =
           (shared_ptr<verona::BtypeDef> *)
           std::
           vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
           ::end(&(ppVar4->second).upper);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<verona::BtypeDef>const*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>
      ::__normal_iterator<std::shared_ptr<verona::BtypeDef>*>
                ((__normal_iterator<std::shared_ptr<verona::BtypeDef>const*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>
                  *)&local_88,&local_90);
      __first = std::
                vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
                ::begin((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
                         *)&(it._M_node)->_M_right);
      __last = std::
               vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
               ::end((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
                      *)&(it._M_node)->_M_right);
      ::std::
      vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>::
      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<verona::BtypeDef>*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>,void>
                ((vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
                  *)&(ppVar3->second).upper,local_88,
                 (__normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
                  )__last._M_current);
    }
    std::_Rb_tree_iterator<std::pair<const_trieste::Location,_verona::Bound>_>::operator++(&__end1);
  }
  return;
}

Assistant:

void merge(Bounds& lhs, Bounds& rhs)
  {
    for (auto& [k, v] : rhs)
    {
      auto it = lhs.find(k);

      if (it == lhs.end())
      {
        lhs[k] = v;
      }
      else
      {
        // TODO: subsume bounds?
        it->second.lower.insert(
          it->second.lower.end(), v.lower.begin(), v.lower.end());
        it->second.upper.insert(
          it->second.upper.end(), v.upper.begin(), v.upper.end());
      }
    }
  }